

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O1

void compact_suite::fail_int16_overflow(void)

{
  size_type sVar1;
  array<short,_1UL> buffer;
  value_type input [8];
  reader reader;
  short local_aa [17];
  uchar local_88 [8];
  reader local_80;
  
  local_88[0] = 0xaa;
  local_88[1] = '\x06';
  local_88[2] = 'A';
  local_88[3] = '\0';
  local_88[4] = 'B';
  local_88[5] = '\0';
  local_88[6] = 'C';
  local_88[7] = '\0';
  trial::protocol::bintoken::reader::reader<unsigned_char[8]>(&local_80,&local_88);
  sVar1 = trial::protocol::bintoken::reader::length(&local_80);
  boost::detail::test_impl
            ("reader.length() == 3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x3d8,"void compact_suite::fail_int16_overflow()",sVar1 == 3);
  local_aa[0] = 0;
  trial::protocol::bintoken::reader::overloader<short,_void>::convert(&local_80,local_aa,1);
  boost::detail::throw_failed_impl
            ("reader.array<std::int16_t>(buffer.data(), buffer.size())","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x3db,"void compact_suite::fail_int16_overflow()");
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)&local_80.stack);
  return;
}

Assistant:

void fail_int16_overflow()
{
    const value_type input[] = {
        token::code::array8_int16, 3 * token::int16::size,
        0x41, 0x00,
        0x42, 0x00,
        0x43, 0x00 };
    format::reader reader(input);
    TRIAL_PROTOCOL_TEST(reader.length() == 3);
    std::array<std::int16_t, 1> buffer = {};
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.array<std::int16_t>(buffer.data(), buffer.size()),
                                    format::error, "overflow");
}